

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderHelperInvocationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::FboHelper::FboHelper
          (FboHelper *this,RenderContext *renderCtx,int width,int height,deUint32 format,
          int numSamples)

{
  int iVar1;
  GLenum GVar2;
  undefined4 extraout_var;
  TestError *this_00;
  NotSupportedError *this_01;
  deUint32 pname;
  allocator<char> local_59;
  Renderbuffer *local_58;
  string local_50;
  Functions *gl;
  
  this->m_renderCtx = renderCtx;
  this->m_numSamples = width;
  *(undefined8 *)(this->m_size).m_data = 0x10000000100;
  local_58 = &this->m_colorbuffer;
  glu::TypedObjectWrapper<(glu::ObjectType)2>::TypedObjectWrapper(local_58,renderCtx);
  glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper(&this->m_framebuffer,renderCtx);
  glu::TypedObjectWrapper<(glu::ObjectType)2>::TypedObjectWrapper
            (&this->m_resolveColorbuffer,renderCtx);
  glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper
            (&this->m_resolveFramebuffer,renderCtx);
  pname = (deUint32)renderCtx;
  iVar1 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar1);
  iVar1 = getInteger(gl,pname);
  (*gl->bindRenderbuffer)(0x8d41,(this->m_colorbuffer).super_ObjectWrapper.m_object);
  (*gl->renderbufferStorageMultisample)(0x8d41,this->m_numSamples,0x8058,0x100,0x100);
  (*gl->bindFramebuffer)(0x8d40,(this->m_framebuffer).super_ObjectWrapper.m_object);
  (*gl->framebufferRenderbuffer)
            (0x8d40,0x8ce0,0x8d41,(this->m_colorbuffer).super_ObjectWrapper.m_object);
  if (iVar1 < this->m_numSamples) {
    GVar2 = (*gl->checkFramebufferStatus)(0x8d40);
    if (GVar2 != 0x8cd5) {
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"Sample count exceeds GL_MAX_SAMPLES",&local_59);
      tcu::NotSupportedError::NotSupportedError(this_01,&local_50);
      __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  GVar2 = (*gl->checkFramebufferStatus)(0x8d40);
  if (GVar2 == 0x8cd5) {
    if (this->m_numSamples != 0) {
      (*gl->bindRenderbuffer)(0x8d41,(this->m_resolveColorbuffer).super_ObjectWrapper.m_object);
      (*gl->renderbufferStorage)(0x8d41,0x8058,0x100,0x100);
      (*gl->bindFramebuffer)(0x8d40,(this->m_resolveFramebuffer).super_ObjectWrapper.m_object);
      (*gl->framebufferRenderbuffer)
                (0x8d40,0x8ce0,0x8d41,(this->m_resolveColorbuffer).super_ObjectWrapper.m_object);
      GVar2 = (*gl->checkFramebufferStatus)(0x8d40);
      if (GVar2 != 0x8cd5) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,(char *)0x0,
                   "gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderHelperInvocationTests.cpp"
                   ,0xf8);
        goto LAB_00591ecd;
      }
    }
    GVar2 = (*gl->getError)();
    glu::checkError(GVar2,"Failed to create framebuffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderHelperInvocationTests.cpp"
                    ,0xfb);
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,
             "gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderHelperInvocationTests.cpp"
             ,0xf0);
LAB_00591ecd:
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

FboHelper::FboHelper (const glu::RenderContext& renderCtx, int width, int height, deUint32 format, int numSamples)
	: m_renderCtx			(renderCtx)
	, m_numSamples			(numSamples)
	, m_size				(width, height)
	, m_colorbuffer			(renderCtx)
	, m_framebuffer			(renderCtx)
	, m_resolveColorbuffer	(renderCtx)
	, m_resolveFramebuffer	(renderCtx)
{
	const glw::Functions&	gl			= m_renderCtx.getFunctions();
	const int				maxSamples	= getInteger(gl, GL_MAX_SAMPLES);

	gl.bindRenderbuffer(GL_RENDERBUFFER, *m_colorbuffer);
	gl.renderbufferStorageMultisample(GL_RENDERBUFFER, m_numSamples, format, width, height);
	gl.bindFramebuffer(GL_FRAMEBUFFER, *m_framebuffer);
	gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, *m_colorbuffer);

	if (m_numSamples > maxSamples && gl.checkFramebufferStatus(GL_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE)
		throw tcu::NotSupportedError("Sample count exceeds GL_MAX_SAMPLES");

	TCU_CHECK(gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE);

	if (m_numSamples != 0)
	{
		gl.bindRenderbuffer(GL_RENDERBUFFER, *m_resolveColorbuffer);
		gl.renderbufferStorage(GL_RENDERBUFFER, format, width, height);
		gl.bindFramebuffer(GL_FRAMEBUFFER, *m_resolveFramebuffer);
		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, *m_resolveColorbuffer);
		TCU_CHECK(gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to create framebuffer");
}